

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chart.cpp
# Opt level: O0

string * __thiscall
Chart::renderSubTotal(string *__return_storage_ptr__,Chart *this,time_t total_work,string *padding)

{
  undefined1 auVar1 [16];
  _Setfill<char> _Var2;
  _Setw _Var3;
  ostream *poVar4;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  Color local_1f0;
  string local_1e8;
  int local_1b8;
  int local_1b4;
  int minutes;
  int hours;
  stringstream out;
  ostream local_1a0 [376];
  string *local_28;
  string *padding_local;
  time_t total_work_local;
  Chart *this_local;
  
  local_28 = padding;
  padding_local = (string *)total_work;
  total_work_local = (time_t)this;
  this_local = (Chart *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&minutes);
  local_1b4 = (int)(SUB168(SEXT816((long)padding_local) * SEXT816(0x48d159e26af37c05),8) >> 10) -
              (SUB164(SEXT816((long)padding_local) * SEXT816(0x48d159e26af37c05),0xc) >> 0x1f);
  auVar1 = SEXT816((long)padding_local % 0xe10) * ZEXT816(0x8888888888888889);
  local_1b8 = (int)(auVar1._8_8_ >> 5) - (auVar1._12_4_ >> 0x1f);
  poVar4 = std::operator<<(local_1a0,(string *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"underline",&local_211);
  Color::Color(&local_1f0,&local_210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"      ",&local_239);
  Color::colorize(&local_1e8,&local_1f0,&local_238);
  poVar4 = std::operator<<(poVar4,(string *)&local_1e8);
  poVar4 = std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<(poVar4,(string *)local_28);
  _Var3 = std::setw(3);
  poVar4 = std::operator<<(poVar4,_Var3);
  _Var2 = std::setfill<char>(' ');
  poVar4 = std::operator<<(poVar4,_Var2._M_c);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1b4);
  poVar4 = std::operator<<(poVar4,':');
  _Var3 = std::setw(2);
  poVar4 = std::operator<<(poVar4,_Var3);
  _Var2 = std::setfill<char>('0');
  poVar4 = std::operator<<(poVar4,_Var2._M_c);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1b8);
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&minutes);
  return __return_storage_ptr__;
}

Assistant:

std::string Chart::renderSubTotal (
  time_t total_work,
  const std::string& padding)
{
  std::stringstream out;

  int hours = total_work / 3600;
  int minutes = (total_work % 3600) / 60;

  out << padding
      << Color ("underline").colorize ("      ")
      << '\n'
      << padding
      << std::setw (3) << std::setfill (' ') << hours
      << ':'
      << std::setw (2) << std::setfill ('0') << minutes
      << '\n';

  return out.str ();
}